

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::ImageFeatureType_ImageSizeRange::ByteSizeLong
          (ImageFeatureType_ImageSizeRange *this)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  ImageFeatureType_ImageSizeRange *this_local;
  
  sStack_18 = 0;
  bVar1 = has_widthrange(this);
  if (bVar1) {
    sStack_18 = google::protobuf::internal::WireFormatLite::
                MessageSizeNoVirtual<CoreML::Specification::SizeRange>(this->widthrange_);
    sStack_18 = sStack_18 + 1;
  }
  bVar1 = has_heightrange(this);
  if (bVar1) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::SizeRange>(this->heightrange_);
    sStack_18 = sVar3 + 1 + sStack_18;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar2;
  return sStack_18;
}

Assistant:

size_t ImageFeatureType_ImageSizeRange::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ImageFeatureType.ImageSizeRange)
  size_t total_size = 0;

  // .CoreML.Specification.SizeRange widthRange = 1;
  if (this->has_widthrange()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->widthrange_);
  }

  // .CoreML.Specification.SizeRange heightRange = 2;
  if (this->has_heightrange()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->heightrange_);
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}